

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O2

void __thiscall
bgui::ListImageWindow::onKey(ListImageWindow *this,char c,SpecialKey key,int x,int y)

{
  int iVar1;
  int pos;
  
  if (key == k_right) {
    iVar1 = this->current;
    pos = iVar1 + 1;
    this->current = pos;
    if (pos < (int)((ulong)((long)(this->name).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->name).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
LAB_00118a2c:
      set(this,pos,-1,-1,false);
    }
    else {
      this->current = iVar1;
    }
  }
  else {
    if (key != k_left) goto LAB_00118a59;
    if (0 < this->current) {
      pos = this->current + -1;
      this->current = pos;
      goto LAB_00118a2c;
    }
  }
  BaseWindow::setInfoLine((BaseWindow *)this,"",true,true);
LAB_00118a59:
  if (c == 'k') {
    if ((ulong)this->kp < 3) {
      this->kp = *(keep *)(&DAT_0011c948 + (ulong)this->kp * 4);
    }
    updateTitle(this);
  }
  ImageWindow::onKey(&this->super_ImageWindow,c,key,x,y);
  return;
}

Assistant:

void ListImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  switch (key)
  {
    case k_left: /* load previous image */
      if (current > 0)
      {
        current--;
        set(current);
      }

      setInfoLine("");
      break;

    case k_right: /* load next image */
      current++;

      if (current < static_cast<int>(name.size()))
      {
        set(current);
      }
      else
      {
        current--;
      }

      setInfoLine("");
      break;

    default:
      break;
  }

  switch (c)
  {
    case 'k':
      switch (kp)
      {
        case keep_none:
          kp=keep_most;
          break;

        case keep_most:
          kp=keep_all;
          break;

        case keep_all:
          kp=keep_none;
          break;
      }

      updateTitle();
      break;
  }

  ImageWindow::onKey(c, key, x, y);
}